

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O1

bool Js::LineOffsetCache::FindNextLine
               (LPCUTF8 *currentSourcePosition,LPCUTF8 sourceEndCharacter,
               charcount_t *inOutCharacterOffset,charcount_t *inOutByteOffset,
               charcount_t maxCharacterOffset)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  char16 cVar4;
  LPCUTF8 previousCharacter;
  charcount_t cVar5;
  byte unaff_R15B;
  DecodeOptions local_3c;
  DecodeOptions local_38;
  DecodeOptions options;
  
  local_38 = *inOutCharacterOffset;
  cVar5 = *inOutByteOffset;
  local_3c = doAllowThreeByteSurrogates;
  options = maxCharacterOffset;
  do {
    pbVar2 = *currentSourcePosition;
    if (sourceEndCharacter <= pbVar2) {
      return false;
    }
    *currentSourcePosition = pbVar2 + 1;
    bVar1 = *pbVar2;
    cVar4 = (char16)bVar1;
    if ((char)bVar1 < '\0') {
      cVar4 = utf8::DecodeTail((ushort)bVar1,currentSourcePosition,sourceEndCharacter,&local_3c,
                               (bool *)0x0);
    }
    if (((ushort)cVar4 - 0x2028 < 2) || (cVar4 == L'\n')) {
      bVar3 = true;
    }
    else if (cVar4 == L'\r') {
      bVar3 = true;
      if (**currentSourcePosition == '\n') {
        *currentSourcePosition = *currentSourcePosition + 1;
        local_38 = local_38 + doAllowThreeByteSurrogates;
      }
    }
    else {
      bVar3 = false;
    }
    local_38 = local_38 + doAllowThreeByteSurrogates;
    cVar5 = cVar5 + (*(int *)currentSourcePosition - (int)pbVar2);
    if (!bVar3) {
      unaff_R15B = unaff_R15B & local_38 < options;
    }
    else {
      *inOutCharacterOffset = local_38;
      *inOutByteOffset = cVar5;
      unaff_R15B = true;
    }
  } while (!bVar3 && local_38 < options);
  return (bool)unaff_R15B;
}

Assistant:

bool LineOffsetCache::FindNextLine(_In_z_ LPCUTF8 &currentSourcePosition, _In_z_ LPCUTF8 sourceEndCharacter, charcount_t &inOutCharacterOffset, charcount_t &inOutByteOffset, charcount_t maxCharacterOffset)
    {
        charcount_t currentCharacterOffset = inOutCharacterOffset;
        charcount_t currentByteOffset = inOutByteOffset;
        utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

        while (currentSourcePosition < sourceEndCharacter)
        {
            LPCUTF8 previousCharacter = currentSourcePosition;

            // Decode from UTF8 to wide char.  Note that Decode will advance the current character by 1 at least.
            char16 decodedCharacter = utf8::Decode(currentSourcePosition, sourceEndCharacter, options);

            bool wasLineEncountered = false;
            switch (decodedCharacter)
            {
            case _u('\r'):
                // Check if the next character is a '\n'.  If so, consume that character as well
                // (consider as one line).
                if (*currentSourcePosition == '\n')
                {
                    ++currentSourcePosition;
                    ++currentCharacterOffset;
                }

                // Intentional fall-through.
            case _u('\n'):
            case 0x2028:
            case 0x2029:
                // Found a new line.
                wasLineEncountered = true;
                break;
            }

            // Move to the next character offset.
            ++currentCharacterOffset;

            // Count the current byte offset we're at in the UTF-8 buffer.
            // The character size can be > 1 for unicode characters.
            currentByteOffset += static_cast<int>(currentSourcePosition - previousCharacter);

            if (wasLineEncountered)
            {
                inOutCharacterOffset = currentCharacterOffset;
                inOutByteOffset = currentByteOffset;
                return true;
            }
            else if (currentCharacterOffset >= maxCharacterOffset)
            {
                return false;
            }
        }

        return false;
    }